

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateMouseCursor(void)

{
  int iVar1;
  ImGuiMouseCursor mode;
  ImGuiIO *pIVar2;
  ImGui_ImplGlfw_Data *windowHandle;
  ImGuiMouseCursor imgui_cursor;
  ImGui_ImplGlfw_Data *bd;
  ImGuiIO *io;
  undefined8 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  pIVar2 = ImGui::GetIO();
  windowHandle = ImGui_ImplGlfw_GetBackendData();
  if (((pIVar2->ConfigFlags & 0x20U) == 0) &&
     (iVar1 = glfwGetInputMode((GLFWwindow *)
                               CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                               (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20)), iVar1 != 0x34003))
  {
    mode = ImGui::GetMouseCursor();
    if ((mode == -1) || ((pIVar2->MouseDrawCursor & 1U) != 0)) {
      glfwSetInputMode((GLFWwindow *)windowHandle,mode,in_stack_ffffffffffffffe8);
    }
    else {
      glfwSetCursor((GLFWwindow *)windowHandle,
                    (GLFWcursor *)CONCAT44(mode,in_stack_ffffffffffffffe8));
      glfwSetInputMode((GLFWwindow *)windowHandle,mode,in_stack_ffffffffffffffe8);
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMouseCursor()
{
    ImGuiIO& io = ImGui::GetIO();
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) || glfwGetInputMode(bd->Window, GLFW_CURSOR) == GLFW_CURSOR_DISABLED)
        return;

    ImGuiMouseCursor imgui_cursor = ImGui::GetMouseCursor();
    if (imgui_cursor == ImGuiMouseCursor_None || io.MouseDrawCursor)
    {
        // Hide OS mouse cursor if imgui is drawing it or if it wants no cursor
        glfwSetInputMode(bd->Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    }
    else
    {
        // Show OS mouse cursor
        // FIXME-PLATFORM: Unfocused windows seems to fail changing the mouse cursor with GLFW 3.2, but 3.3 works here.
        glfwSetCursor(bd->Window, bd->MouseCursors[imgui_cursor] ? bd->MouseCursors[imgui_cursor] : bd->MouseCursors[ImGuiMouseCursor_Arrow]);
        glfwSetInputMode(bd->Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    }
}